

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Next
          (ConcatenatingInputStream *this,void **data,int *size)

{
  int iVar1;
  ZeroCopyInputStream **ppZVar2;
  undefined4 extraout_var;
  
  if (0 < this->stream_count_) {
    ppZVar2 = this->streams_;
    do {
      iVar1 = (*(*ppZVar2)->_vptr_ZeroCopyInputStream[2])(*ppZVar2,data,size);
      if ((char)iVar1 != '\0') {
        return (bool)(char)iVar1;
      }
      iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var,iVar1);
      ppZVar2 = this->streams_ + 1;
      this->streams_ = ppZVar2;
      iVar1 = this->stream_count_;
      this->stream_count_ = iVar1 + -1;
    } while (1 < iVar1);
  }
  return false;
}

Assistant:

bool ConcatenatingInputStream::Next(const void** data, int* size) {
  while (stream_count_ > 0) {
    if (streams_[0]->Next(data, size)) return true;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += streams_[0]->ByteCount();
    ++streams_;
    --stream_count_;
  }

  // No more streams.
  return false;
}